

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# 367_validPerfectSqr.cpp
# Opt level: O3

bool isPerfectSquare(int num)

{
  ulong uVar1;
  long lVar2;
  ulong uVar3;
  
  uVar1 = (ulong)num;
  lVar2 = 1;
  do {
    uVar3 = lVar2 * lVar2;
    lVar2 = lVar2 + 1;
  } while (uVar3 < uVar1);
  return uVar3 < uVar1 || uVar3 - uVar1 == 0;
}

Assistant:

bool isPerfectSquare(int num) {
    unsigned long long int i=1;
    while (i*i <= num)
    {
        if (i*i == num)
            return true;
        i++;
    }
    return false;
}